

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lambdamember.cpp
# Opt level: O0

PyObject * pybind11_init(void)

{
  PyObject *pPVar1;
  class_<SomeClass> *pcVar2;
  PyObject **ppPVar3;
  type local_59;
  code *local_58;
  undefined8 local_50;
  cpp_function local_48;
  code *local_40;
  undefined8 local_38;
  init<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2d [13];
  PyObject *local_20;
  class_<SomeClass> local_18;
  handle local_10;
  module m;
  
  pybind11::module::module
            ((module *)&local_10,"lambdamember","pybind11 member class with lambda function example"
            );
  local_20 = local_10.m_ptr;
  pybind11::class_<SomeClass>::class_<>(&local_18,local_10,"SomeClass");
  pybind11::init<std::__cxx11::string>();
  pcVar2 = pybind11::class_<SomeClass>::def<std::__cxx11::string>(&local_18,local_2d);
  pcVar2 = pybind11::class_<SomeClass>::def_readwrite<SomeClass,std::__cxx11::string>
                     (pcVar2,"name",0);
  local_40 = SomeClass::getNumber;
  local_38 = 0;
  local_58 = SomeClass::setNumber;
  local_50 = 0;
  pybind11::cpp_function::cpp_function<void,SomeClass,double>
            (&local_48,(offset_in_SomeClass_to_subr)SomeClass::setNumber);
  pcVar2 = pybind11::class_<SomeClass>::def_property<double(SomeClass::*)()const>
                     (pcVar2,"number",(offset_in_SomeClass_to_subr *)&local_40,&local_48);
  pybind11::class_<SomeClass>::def<pybind11_init()::__0>(pcVar2,"__repr__",&local_59);
  pybind11::cpp_function::~cpp_function(&local_48);
  pybind11::class_<SomeClass>::~class_(&local_18);
  ppPVar3 = pybind11::handle::ptr(&local_10);
  pPVar1 = *ppPVar3;
  pybind11::module::~module((module *)&local_10);
  return pPVar1;
}

Assistant:

PYBIND11_PLUGIN(member)
{
    py::module m("lambdamember","pybind11 member class with lambda function example");

    py::class_<SomeClass>( m, "SomeClass")
        .def(py::init<std::string>())
        .def_readwrite("name", & SomeClass::name)
        .def_property("number", &SomeClass::getNumber, &SomeClass::setNumber)
        .def("__repr__",
            [](const SomeClass &a) {
            return "<example.SomeClass named '" + a.name + "'>";
            });
    ;
    return m.ptr();

}